

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

uint32_t __thiscall
olc::Renderer_OGL10::CreateTexture
          (Renderer_OGL10 *this,uint32_t width,uint32_t height,bool filtered)

{
  uint32_t local_20;
  byte local_19;
  uint32_t id;
  uint32_t uStack_14;
  bool filtered_local;
  uint32_t height_local;
  uint32_t width_local;
  Renderer_OGL10 *this_local;
  
  local_20 = 0;
  local_19 = filtered;
  id = height;
  uStack_14 = width;
  _height_local = this;
  glGenTextures(1,&local_20);
  glBindTexture(0xde1,local_20);
  if ((local_19 & 1) == 0) {
    glTexParameteri(0xde1,0x2800,0x2600);
    glTexParameteri(0xde1,0x2801,0x2600);
  }
  else {
    glTexParameteri(0xde1,0x2801,0x2601);
    glTexParameteri(0xde1,0x2800,0x2601);
  }
  glTexParameteri(0xde1,0x2802,0x2900);
  glTexParameteri(0xde1,0x2803,0x2900);
  glTexEnvf(0x46040000,0x2300,0x2200);
  return local_20;
}

Assistant:

uint32_t CreateTexture(const uint32_t width, const uint32_t height, const bool filtered) override
		{
			UNUSED(width);
			UNUSED(height);
			uint32_t id = 0;
			glGenTextures(1, &id);
			glBindTexture(GL_TEXTURE_2D, id);
			if (filtered)
			{
				glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
				glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			}
			else
			{
				glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
				glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			}

			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP);
			glTexEnvf(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, GL_MODULATE);
			return id;
		}